

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

char * google::protobuf::internal::TcParser::FastGdR2
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  long v1;
  undefined4 uVar1;
  undefined4 uVar2;
  ushort uVar3;
  int iVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  TcParseTableBase *field;
  TcParseTableBase *pTVar9;
  MessageLite *pMVar10;
  ulong uVar11;
  char *pcVar12;
  Nonnull<const_char_*> failure_msg;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar13;
  int iVar14;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  int iVar15;
  long v1_00;
  TcParseTableBase *ptr_00;
  uint *puVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  LogMessageFatal local_88;
  uint64_t local_78;
  MessageLite *local_70;
  TcParseTableBase *local_68;
  ushort uVar19;
  undefined2 uVar20;
  TcParseTableBase *table_00;
  
  if (data.field_0._0_2_ != 0) {
    pcVar12 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar12;
  }
  field = (TcParseTableBase *)((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30));
  if (((ulong)field & 7) != 0) {
    AlignFail(field);
  }
  uVar19 = *(ushort *)ptr;
  local_78 = hasbits;
  local_70 = msg;
  local_68 = table;
  pTVar9 = MessageLite::GetTcParseTable
                     (*(MessageLite **)
                       ((long)&table->has_bits_offset +
                       ((ulong)data.field_0 >> 0x18 & 0xff) * 8 + (ulong)table->aux_offset));
  uVar20 = 0;
  aVar13._0_4_ = (int)(char)uVar19 + (uint)uVar19 >> 1;
  aVar13.data._4_4_ = 0;
  uVar8 = aVar13._0_4_;
  table_00 = pTVar9;
  do {
    ptr_00 = field;
    pMVar10 = AddMessage(table_00,(RepeatedPtrFieldBase *)field);
    auVar17._8_8_ = extraout_RDX;
    auVar17._0_8_ = local_88.super_LogMessage._0_8_;
    iVar14 = ctx->depth_;
    v1 = (long)iVar14 + -1;
    iVar6 = (int)v1;
    ctx->depth_ = iVar6;
    if ((long)iVar14 < 1) goto LAB_002ba759;
    local_88.super_LogMessage._0_8_ = &((TcParseTableBase *)ptr)->extension_offset;
    iVar4 = ctx->group_depth_;
    v1_00 = (long)iVar4 + 1;
    iVar15 = (int)v1_00;
    ctx->group_depth_ = iVar15;
    while( true ) {
      bVar5 = EpsCopyInputStream::DoneWithCheck<false>
                        (&ctx->super_EpsCopyInputStream,(char **)&local_88,ctx->group_depth_);
      auVar17._8_8_ = extraout_RDX_00;
      auVar17._0_8_ = local_88.super_LogMessage._0_8_;
      if (bVar5) break;
      uVar7 = (uint)pTVar9->fast_idx_mask & (uint)*(ushort *)local_88.super_LogMessage._0_8_;
      if ((uVar7 & 7) != 0) goto LAB_002ba864;
      uVar11 = (ulong)(uVar7 & 0xfffffff8);
      aVar13.data = (ulong)*(ushort *)local_88.super_LogMessage._0_8_ ^
                    *(ulong *)(&pTVar9[1].fast_idx_mask + uVar11 * 2);
      auVar17 = (**(code **)(&pTVar9[1].has_bits_offset + uVar11))
                          (pMVar10,local_88.super_LogMessage._0_8_,ctx,aVar13.data,pTVar9,0);
      local_88.super_LogMessage._0_8_ = auVar17._0_8_;
      if (((TcParseTableBase *)local_88.super_LogMessage._0_8_ == (TcParseTableBase *)0x0) ||
         ((ctx->super_EpsCopyInputStream).last_tag_minus_1_ != 0)) break;
    }
    local_88.super_LogMessage._0_8_ = auVar17._0_8_;
    if ((pTVar9->field_0x9 & 1) == 0) {
      ptr = (char *)local_88.super_LogMessage._0_8_;
      if ((TcParseTableBase *)local_88.super_LogMessage._0_8_ == (TcParseTableBase *)0x0) {
        ptr_00 = pTVar9;
        VerifyHasBitConsistency((MessageLite *)CONCAT44(uVar8,CONCAT22(uVar20,uVar19)),table_00);
        auVar18._8_8_ = extraout_RDX_01;
        auVar18._0_8_ = local_88.super_LogMessage._0_8_;
        goto LAB_002ba72c;
      }
    }
    else {
      ptr_00 = (TcParseTableBase *)local_88.super_LogMessage._0_8_;
      auVar18 = (undefined1  [16])
                (*pTVar9->post_loop_handler)(pMVar10,(char *)local_88.super_LogMessage._0_8_,ctx);
LAB_002ba72c:
      auVar17._8_8_ = auVar18._8_8_;
      auVar17._0_8_ = local_88.super_LogMessage._0_8_;
      ptr = (char *)auVar18._0_8_;
      if (auVar18._0_8_ == (TcParseTableBase *)0x0) {
        uVar1 = ctx->depth_;
        uVar2 = ctx->group_depth_;
        ctx->depth_ = uVar1 + 1;
        ctx->group_depth_ = uVar2 + -1;
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
        goto LAB_002ba759;
      }
    }
    local_88.super_LogMessage._0_8_ = auVar17._0_8_;
    if (iVar6 != ctx->depth_) {
      failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                              (v1,(long)ctx->depth_,"old_depth == depth_");
      iVar14 = 0x491;
LAB_002ba7fd:
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                (&local_88,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
                 ,iVar14,failure_msg);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_88);
    }
    ptr_00 = (TcParseTableBase *)(long)ctx->group_depth_;
    if (iVar15 != ctx->group_depth_) {
      failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                              (v1_00,(long)ptr_00,"old_group_depth == group_depth_");
      iVar14 = 0x492;
      goto LAB_002ba7fd;
    }
    ctx->group_depth_ = iVar4;
    ctx->depth_ = iVar14;
    uVar7 = (ctx->super_EpsCopyInputStream).last_tag_minus_1_;
    (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
    if (uVar7 != uVar8) {
LAB_002ba759:
      local_88.super_LogMessage._0_8_ = auVar17._0_8_;
      pcVar12 = Error(local_70,(char *)ptr_00,auVar17._8_8_,(TcFieldData)aVar13,local_68,local_78);
      return pcVar12;
    }
    if ((TcParseTableBase *)(ctx->super_EpsCopyInputStream).limit_end_ <= ptr) {
      if ((ulong)local_68->has_bits_offset != 0) {
        puVar16 = (uint *)((long)&local_70->_vptr_MessageLite + (ulong)local_68->has_bits_offset);
        if (((ulong)puVar16 & 3) != 0) {
          AlignFail();
        }
        *puVar16 = *puVar16 | (uint)local_78;
      }
      return (char *)(TcParseTableBase *)ptr;
    }
    uVar3 = ((TcParseTableBase *)ptr)->has_bits_offset;
    aVar13.data._2_6_ = 0;
    aVar13.data._0_2_ = uVar3;
    if (uVar3 != uVar19) {
      uVar8 = (uint)local_68->fast_idx_mask & (uint)uVar3;
      if ((uVar8 & 7) == 0) {
        uVar11 = (ulong)(uVar8 & 0xfffffff8);
        pcVar12 = (char *)(**(code **)(&local_68[1].has_bits_offset + uVar11))
                                    (local_70,ptr,ctx,
                                     aVar13.data ^
                                     *(ulong *)(&local_68[1].fast_idx_mask + uVar11 * 2),local_68,
                                     local_78);
        return pcVar12;
      }
LAB_002ba864:
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
  } while( true );
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastGdR2(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return RepeatedParseMessageAuxImpl<uint16_t, true, false>(
      PROTOBUF_TC_PARAM_PASS);
}